

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O1

Mat * __thiscall
ncnn::ModelBin::load(Mat *__return_storage_ptr__,ModelBin *this,int w,int h,int type)

{
  int *piVar1;
  size_t sVar2;
  void *pvVar3;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  Mat m;
  void *local_68;
  int *local_60;
  size_t local_58;
  Allocator *local_50;
  int local_48;
  int local_44;
  int iStack_40;
  int local_3c;
  size_t local_38;
  
  uVar5 = h * w;
  (**this->_vptr_ModelBin)(&local_68,this,(ulong)uVar5,(ulong)(uint)type);
  sVar2 = local_58;
  if ((local_68 == (void *)0x0) || ((long)local_3c * local_38 == 0)) {
    __return_storage_ptr__->data = local_68;
    __return_storage_ptr__->refcount = local_60;
    __return_storage_ptr__->elemsize = local_58;
    __return_storage_ptr__->allocator = local_50;
    __return_storage_ptr__->dims = local_48;
    if (local_60 != (int *)0x0) {
      LOCK();
      *local_60 = *local_60 + 1;
      UNLOCK();
    }
    __return_storage_ptr__->w = local_44;
    __return_storage_ptr__->h = iStack_40;
    __return_storage_ptr__->c = local_3c;
  }
  else {
    if (iStack_40 * local_44 * local_3c != uVar5) {
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->cstep = 0;
      goto LAB_001319ee;
    }
    if ((local_48 == 3) && (local_38 != (long)iStack_40 * (long)local_44)) {
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->cstep = 0;
      if (((__return_storage_ptr__->dims != 2) ||
          (((__return_storage_ptr__->w != w || (__return_storage_ptr__->h != h)) ||
           (__return_storage_ptr__->elemsize != local_58)))) ||
         (__return_storage_ptr__->allocator != (Allocator *)0x0)) {
        piVar1 = __return_storage_ptr__->refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (__return_storage_ptr__->allocator == (Allocator *)0x0) {
              if (__return_storage_ptr__->data != (void *)0x0) {
                free(*(void **)((long)__return_storage_ptr__->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)__return_storage_ptr__->allocator + 8))();
            }
          }
        }
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->elemsize = 0;
        __return_storage_ptr__->cstep = 0;
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->elemsize = sVar2;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->dims = 2;
        __return_storage_ptr__->w = w;
        __return_storage_ptr__->h = h;
        __return_storage_ptr__->c = 1;
        __return_storage_ptr__->cstep = (long)(int)uVar5;
        if (uVar5 != 0) {
          uVar6 = sVar2 * (long)(int)uVar5 + 3 & 0xfffffffffffffffc;
          pvVar3 = malloc(uVar6 + 0x1c);
          pvVar4 = (void *)((long)pvVar3 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar4 - 8) = pvVar3;
          __return_storage_ptr__->data = pvVar4;
          __return_storage_ptr__->refcount = (int *)((long)pvVar4 + uVar6);
          *(undefined4 *)((long)pvVar4 + uVar6) = 1;
        }
      }
      if (0 < local_3c) {
        lVar7 = 0;
        do {
          memcpy((void *)((long)((int)lVar7 * iStack_40 * local_44) * local_58 +
                         (long)__return_storage_ptr__->data),
                 (void *)(local_38 * lVar7 * local_58 + (long)local_68),
                 (long)(iStack_40 * local_44) * local_58);
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_3c);
      }
      goto LAB_001319ee;
    }
    __return_storage_ptr__->data = local_68;
    __return_storage_ptr__->refcount = local_60;
    __return_storage_ptr__->elemsize = local_58;
    __return_storage_ptr__->allocator = local_50;
    __return_storage_ptr__->dims = local_48;
    if (local_60 != (int *)0x0) {
      LOCK();
      *local_60 = *local_60 + 1;
      UNLOCK();
    }
    __return_storage_ptr__->w = local_44;
    __return_storage_ptr__->h = iStack_40;
    __return_storage_ptr__->dims = 2;
    __return_storage_ptr__->w = w;
    __return_storage_ptr__->h = h;
    __return_storage_ptr__->c = 1;
    local_38 = (size_t)(int)uVar5;
  }
  __return_storage_ptr__->cstep = local_38;
LAB_001319ee:
  if (local_60 != (int *)0x0) {
    LOCK();
    *local_60 = *local_60 + -1;
    UNLOCK();
    if (*local_60 == 0) {
      if (local_50 == (Allocator *)0x0) {
        if (local_68 != (void *)0x0) {
          free(*(void **)((long)local_68 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_50 + 8))();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}